

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>_>::
rehash(Data<QHashPrivate::Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>_> *this,
      size_t sizeHint)

{
  ulong uVar1;
  Span *pSVar2;
  Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo> *this_00;
  ulong uVar3;
  size_t index;
  long lVar4;
  Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo> *key;
  Span *pSVar5;
  size_t numBuckets;
  long lVar6;
  long in_FS_OFFSET;
  R RVar7;
  Bucket local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  numBuckets = 0x80;
  if (0x40 < sizeHint) {
    if (sizeHint >> 0x3e == 0) {
      lVar4 = 0x3f;
      if (sizeHint != 0) {
        for (; sizeHint >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      numBuckets = 1L << (0x41 - ((byte)lVar4 ^ 0x3f) & 0x3f);
    }
    else {
      numBuckets = 0xffffffffffffffff;
    }
  }
  uVar1 = this->numBuckets;
  pSVar2 = this->spans;
  RVar7 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar7.spans;
  this->numBuckets = numBuckets;
  pSVar5 = pSVar2;
  for (uVar3 = 0; uVar3 != uVar1 >> 7; uVar3 = uVar3 + 1) {
    for (lVar4 = 0; lVar4 != 0x80; lVar4 = lVar4 + 1) {
      if (pSVar5->offsets[lVar4] != 0xff) {
        key = (Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo> *)
              (pSVar2[uVar3].entries + pSVar5->offsets[lVar4]);
        local_48.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
        local_48.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
        local_48 = Data<QHashPrivate::Node<QNetworkReply*,QRestAccessManagerPrivate::CallerInfo>>::
                   findBucket<QNetworkReply*>
                             ((Data<QHashPrivate::Node<QNetworkReply*,QRestAccessManagerPrivate::CallerInfo>>
                               *)this,(QNetworkReply **)key);
        this_00 = Bucket::insert(&local_48);
        Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>::Node(this_00,key);
      }
    }
    Span<QHashPrivate::Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>_>::freeData
              (pSVar2 + uVar3);
    pSVar5 = pSVar5 + 1;
  }
  if (pSVar2 != (Span *)0x0) {
    lVar4 = *(long *)&pSVar2[-1].allocated;
    if (lVar4 != 0) {
      lVar6 = lVar4 * 0x90;
      do {
        Span<QHashPrivate::Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>_>::freeData
                  ((Span<QHashPrivate::Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>_>
                    *)(pSVar2[-1].offsets + lVar6));
        lVar6 = lVar6 + -0x90;
      } while (lVar6 != 0);
    }
    operator_delete__(&pSVar2[-1].allocated,lVar4 * 0x90 | 8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }